

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

BigInteger * __thiscall BigInteger::operator+=(BigInteger *this,BigInteger *a)

{
  uint uVar1;
  BigInteger *pBVar2;
  compare_t cVar3;
  ulong in_RAX;
  pointer puVar4;
  uint uVar5;
  pointer puVar6;
  pointer puVar7;
  iterator iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  BigInteger *pBVar14;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (this->negative == a->negative) {
    puVar6 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8._M_current =
         (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (3 < (ulong)((long)puVar7 - (long)puVar6 | (long)iVar8._M_current - (long)puVar4)) {
      uVar9 = (long)iVar8._M_current - (long)puVar4 >> 2;
      uVar12 = 0;
      uVar13 = 0;
      do {
        if (uVar9 <= uVar13) {
          local_38 = local_38 & 0xffffffff;
          if (iVar8._M_current ==
              (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->digits,iVar8,(uint *)((long)&local_38 + 4));
            puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            puVar6 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *iVar8._M_current = 0;
            (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          puVar7 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar11 = (long)puVar7 - (long)puVar6 >> 2;
        uVar10 = 0;
        if (uVar13 < uVar11) {
          uVar10 = puVar6[uVar13];
        }
        uVar10 = puVar4[uVar13] + (int)uVar12 + uVar10;
        uVar9 = (ulong)(uVar10 >> 9) * 0x44b83;
        uVar12 = uVar9 >> 0x27;
        puVar4[uVar13] = uVar10 + (uint)(uVar9 >> 0x27) * -1000000000;
        uVar13 = uVar13 + 1;
        iVar8._M_current =
             (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar9 = (long)iVar8._M_current - (long)puVar4 >> 2;
        if (uVar11 <= uVar9) {
          uVar11 = uVar9;
        }
      } while ((uVar13 < uVar11) || (999999999 < uVar10));
    }
  }
  else {
    cVar3 = _compareAbs(this,a);
    pBVar14 = a;
    pBVar2 = this;
    if (cVar3 < CMP_EQUAL) {
      pBVar14 = this;
      pBVar2 = a;
    }
    this->negative = pBVar2->negative;
    puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar10 = 0;
      uVar9 = 0;
      do {
        iVar8._M_current =
             (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if ((ulong)((long)iVar8._M_current - (long)puVar4 >> 2) <= uVar9) {
          local_38 = local_38 & 0xffffffff00000000;
          if (iVar8._M_current ==
              (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->digits,iVar8,(uint *)&local_38);
          }
          else {
            *iVar8._M_current = 0;
            (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
        }
        puVar4 = (pBVar14->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = 0;
        if (uVar9 < (ulong)((long)(pBVar14->digits).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2)) {
          uVar5 = puVar4[uVar9];
        }
        uVar5 = uVar5 + uVar10;
        uVar1 = (pBVar2->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9];
        uVar10 = (uVar1 - uVar5) + 1000000000;
        if (uVar5 <= uVar1) {
          uVar10 = uVar1 - uVar5;
        }
        puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4[uVar9] = uVar10;
        uVar9 = uVar9 + 1;
        uVar10 = (uint)(uVar1 < uVar5);
      } while ((uVar1 < uVar5) ||
              (uVar9 < (ulong)((long)(a->digits).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(a->digits).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2)));
    }
  }
  puVar6 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar4) {
LAB_00124e16:
      this->negative = false;
      return this;
    }
    puVar7 = puVar6 + -1;
    if (*puVar7 != 0) {
      if (puVar6 != puVar4) {
        return this;
      }
      goto LAB_00124e16;
    }
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
    puVar6 = puVar7;
  } while( true );
}

Assistant:

BigInteger &BigInteger::operator+=(const BigInteger &a) noexcept
{
    bool sub = negative ^a.negative;
    int rem = 0;
    if(!sub)  // addition
    {
        for(size_t i = 0; i < std::max(a.digits.size(), digits.size()) || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            digits[i] = digits[i] + (a.digits.size() > i ? a.digits[i] : 0) + rem;
            rem = digits[i] / BLOCK_MOD;
            digits[i] %= BLOCK_MOD;
        }
    }
    else
    {
        bool rev = _compareAbs(a) < 0;
        const BigInteger &big = (rev ? a : *this), &small = (rev ? *this : a);
        negative = big.negative;
        for(size_t i = 0; i < a.digits.size() || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            unsigned dig = (small.digits.size() > i ? small.digits[i] : 0);
            if(big.digits[i] >= dig + rem)
            {
                digits[i] = big.digits[i] - dig - rem;
                rem = 0;
            }
            else
            {
                digits[i] = BLOCK_MOD + big.digits[i] - dig - rem;
                rem = 1;
            }
        }
    }
    normalize();
    return *this;
}